

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall tcu::lookup(tcu *this,ConstPixelBufferAccess *access,int i,int j,int k)

{
  bool bVar1;
  int x;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  Vec4 VVar2;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  TextureFormat *local_30;
  TextureFormat *format;
  int local_20;
  int k_local;
  int j_local;
  int i_local;
  ConstPixelBufferAccess *access_local;
  
  format._4_4_ = k;
  local_20 = j;
  k_local = i;
  _j_local = access;
  access_local = (ConstPixelBufferAccess *)this;
  local_30 = ConstPixelBufferAccess::getFormat(access);
  local_48._16_8_ = *local_30;
  bVar1 = isSRGB((TextureFormat)local_48._16_8_);
  x = (int)_j_local;
  if (bVar1) {
    if ((local_30->type == UNORM_INT8) && (local_30->order == sRGB)) {
      ConstPixelBufferAccess::getPixelUint((ConstPixelBufferAccess *)local_48,x,k_local,local_20);
      VVar2 = sRGB8ToLinear(this,(UVec4 *)local_48);
    }
    else if ((local_30->type == UNORM_INT8) && (local_30->order == sRGBA)) {
      ConstPixelBufferAccess::getPixelUint((ConstPixelBufferAccess *)local_58,x,k_local,local_20);
      VVar2 = sRGBA8ToLinear(this,(UVec4 *)local_58);
    }
    else {
      ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,x,k_local,local_20);
      VVar2 = sRGBToLinear(this,(Vec4 *)local_68);
    }
  }
  else {
    VVar2 = ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)this,x,k_local,local_20);
  }
  VVar2.m_data[0] = VVar2.m_data[0];
  auVar3._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

static inline Vec4 lookup (const ConstPixelBufferAccess& access, int i, int j, int k)
{
	const TextureFormat&	format	= access.getFormat();

	if (isSRGB(format))
	{
		if (format.type == TextureFormat::UNORM_INT8 && format.order == TextureFormat::sRGB)
				return sRGB8ToLinear(access.getPixelUint(i, j, k));
		else if (format.type == TextureFormat::UNORM_INT8 && format.order == TextureFormat::sRGBA)
				return sRGBA8ToLinear(access.getPixelUint(i, j, k));
		else
			return sRGBToLinear(access.getPixel(i, j, k));
	}
	else
	{
		return access.getPixel(i, j, k);
	}
}